

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
::swap(sparse_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
       *this,sparse_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
             *ht)

{
  Settings *in_RSI;
  sparsetable<std::pair<const_A,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  *in_RDI;
  sparsetable<std::pair<const_A,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  *in_stack_ffffffffffffffd8;
  
  std::
  swap<google::sparse_hashtable<std::pair<A_const,int>,A,HashA,google::sparse_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SelectKey,google::sparse_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SetKey,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::Settings>
            ((Settings *)in_RDI,in_RSI);
  std::
  swap<google::sparse_hashtable<std::pair<A_const,int>,A,HashA,google::sparse_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SelectKey,google::sparse_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SetKey,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::KeyInfo>
            ((KeyInfo *)in_RDI,(KeyInfo *)in_stack_ffffffffffffffd8);
  std::swap<unsigned_long>
            ((unsigned_long *)(in_RDI + 1),
             &in_RSI[1].super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.shrink_threshold_);
  sparsetable<std::pair<const_A,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  ::swap(in_RDI,in_stack_ffffffffffffffd8);
  bucket_count((sparse_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
                *)0x10b06f1);
  sparsehash_internal::sh_hashtable_settings<A,_HashA,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<A,_HashA,_unsigned_long,_4> *)in_RDI,
             (size_type)in_stack_ffffffffffffffd8);
  bucket_count((sparse_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
                *)0x10b0712);
  sparsehash_internal::sh_hashtable_settings<A,_HashA,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<A,_HashA,_unsigned_long,_4> *)in_RDI,
             (size_type)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void swap(sparse_hashtable& ht) {
    std::swap(settings, ht.settings);
    std::swap(key_info, ht.key_info);
    std::swap(num_deleted, ht.num_deleted);
    table.swap(ht.table);
    settings.reset_thresholds(bucket_count());  // also resets consider_shrink
    ht.settings.reset_thresholds(ht.bucket_count());
    // we purposefully don't swap the allocator, which may not be swap-able
  }